

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O1

int ImfHeaderSetIntAttribute(ImfHeader *hdr,char *name,int value)

{
  int iVar1;
  Iterator IVar2;
  iterator iVar3;
  TypedAttribute<int> *pTVar4;
  int local_34;
  TypedAttribute<int> local_30;
  
  local_34 = value;
  IVar2 = Imf_3_4::Header::find((Header *)hdr,name);
  iVar3._M_node = (_Base_ptr)Imf_3_4::Header::end((Header *)hdr);
  iVar1 = local_34;
  if (IVar2._i._M_node == (iterator)iVar3._M_node) {
    Imf_3_4::TypedAttribute<int>::TypedAttribute(&local_30,&local_34);
    Imf_3_4::Header::insert((Header *)hdr,name,&local_30.super_Attribute);
    Imf_3_4::TypedAttribute<int>::~TypedAttribute(&local_30);
  }
  else {
    pTVar4 = Imf_3_4::Header::typedAttribute<Imf_3_4::TypedAttribute<int>>((Header *)hdr,name);
    pTVar4->_value = iVar1;
  }
  return 1;
}

Assistant:

int
ImfHeaderSetIntAttribute (ImfHeader* hdr, const char name[], int value)
{
    try
    {
        if (header (hdr)->find (name) == header (hdr)->end ())
        {
            header (hdr)->insert (
                name, OPENEXR_IMF_INTERNAL_NAMESPACE::IntAttribute (value));
        }
        else
        {
            header (hdr)
                ->typedAttribute<OPENEXR_IMF_INTERNAL_NAMESPACE::IntAttribute> (
                    name)
                .value () = value;
        }

        return 1;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}